

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytedata_p.h
# Opt level: O0

ssize_t __thiscall QByteDataBuffer::read(QByteDataBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  QByteArray *this_00;
  qsizetype qVar1;
  undefined4 in_register_00000034;
  QByteDataBuffer *this_01;
  QByteDataBuffer *this_02;
  
  this_01 = (QByteDataBuffer *)CONCAT44(in_register_00000034,__fd);
  this_02 = this;
  squeezeFirst(this_01);
  this_00 = QList<QByteArray>::first(&this_01->buffers);
  qVar1 = QByteArray::size(this_00);
  this_01->bufferCompleteSize = this_01->bufferCompleteSize - qVar1;
  QList<QByteArray>::takeFirst(&this_02->buffers);
  return (ssize_t)this;
}

Assistant:

inline QByteArray read()
    {
        Q_ASSERT(!isEmpty());
        squeezeFirst();
        bufferCompleteSize -= buffers.first().size();
        return buffers.takeFirst();
    }